

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O0

void __thiscall
TPZFileEqnStorage<double>::Print(TPZFileEqnStorage<double> *this,char *name,ostream *out)

{
  FILE *__stream;
  long __off;
  ostream *this_00;
  char *name_00;
  TPZEqnArray<double> *this_01;
  FILE *inputfile;
  long *plVar1;
  ostream *in_RDX;
  TPZEqnArray<double> *in_RDI;
  TPZEqnArray<double> REqnArray;
  int i;
  TPZEqnArray<double> *in_stack_ffffffffffffcd00;
  int local_1c;
  
  TPZEqnArray<double>::TPZEqnArray(in_RDI);
  this_00 = std::operator<<(in_RDX,"Number of entries on File  ");
  name_00 = (char *)TPZVec<long>::NElements
                              ((TPZVec<long> *)
                               &(in_RDI->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.
                                fStore);
  this_01 = (TPZEqnArray<double> *)std::ostream::operator<<(this_00,(long)name_00);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  local_1c = 0;
  while( true ) {
    inputfile = (FILE *)TPZVec<long>::NElements
                                  ((TPZVec<long> *)
                                   &(in_RDI->fEqStart).super_TPZManVector<int,_100>.
                                    super_TPZVec<int>.fStore);
    if ((long)inputfile <= (long)local_1c) break;
    plVar1 = TPZVec<long>::operator[]
                       ((TPZVec<long> *)
                        &(in_RDI->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore,
                        (long)local_1c);
    if (*plVar1 != 0) {
      __stream = *(FILE **)((in_RDI->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + 0x1e);
      in_stack_ffffffffffffcd00 =
           (TPZEqnArray<double> *)
           TPZVec<long>::operator[]
                     ((TPZVec<long> *)
                      &(in_RDI->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore,
                      (long)local_1c);
      __off._0_4_ = in_stack_ffffffffffffcd00->fSymmetric;
      __off._4_4_ = in_stack_ffffffffffffcd00->fNumEq;
      fseek(__stream,__off,0);
      TPZEqnArray<double>::Read(this_01,inputfile);
      TPZEqnArray<double>::Print(in_RDI,name_00,(ostream *)this_01);
    }
    local_1c = local_1c + 1;
  }
  TPZEqnArray<double>::~TPZEqnArray(in_stack_ffffffffffffcd00);
  return;
}

Assistant:

void TPZFileEqnStorage<TVar>::Print(const char *name, std::ostream& out) const {
    int i;
	TPZEqnArray<TVar> REqnArray;
	out <<  "Number of entries on File  "<< fBlockPos.NElements() << endl;
	for(i=0;i<fBlockPos.NElements();i++) {
		if (fBlockPos[i]) {
			fseek(fIOStream,fBlockPos[i],SEEK_SET);
			REqnArray.Read(fIOStream);
			REqnArray.Print(name, out);
		}
	}
}